

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O2

void __thiscall
OpenMD::InversePowerSeries::calcForce(InversePowerSeries *this,InteractionData *idat)

{
  pointer piVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  vector<int,_std::allocator<int>_> powers;
  vector<double,_std::allocator<double>_> coefficients;
  _Vector_base<int,_std::allocator<int>_> local_e0;
  double local_c8;
  double dStack_c0;
  double local_b0;
  double local_a8;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  Vector<double,_3U> local_48;
  Vector<double,_3U> local_30;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar1 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar1[idat->atid1]].
                    super__Vector_base<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar6 = (long)piVar1[idat->atid2] * 0x30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_e0,
             (vector<int,_std::allocator<int>_> *)(lVar2 + lVar6));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a0,
             (vector<double,_std::allocator<double>_> *)(lVar2 + lVar6 + 0x18));
  auVar3._8_4_ = SUB84(idat->rcut,0);
  auVar3._0_8_ = idat->rij;
  auVar3._12_4_ = (int)((ulong)idat->rcut >> 0x20);
  local_88 = divpd(_DAT_00248590,auVar3);
  local_78 = local_88._8_8_;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar10 = 0.0;
  dVar13 = 0.0;
  dStack_70 = local_78;
  for (uVar4 = 0; uVar5 = (ulong)uVar4,
      uVar5 < (ulong)((long)local_e0._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e0._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar4 = uVar4 + 1) {
    local_c8 = local_a0._M_impl.super__Vector_impl_data._M_start[uVar5];
    dStack_c0 = 0.0;
    local_b0 = dVar10;
    local_a8 = dVar13;
    local_58 = dVar11;
    dStack_50 = dVar12;
    dVar10 = pow((double)local_88._0_8_,
                 (double)local_e0._M_impl.super__Vector_impl_data._M_start[uVar5]);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_8_ = dVar10;
    local_68._12_4_ = extraout_XMM0_Dd;
    dStack_c0 = local_a0._M_impl.super__Vector_impl_data._M_start[uVar5];
    dVar12 = pow(local_78,(double)local_e0._M_impl.super__Vector_impl_data._M_start[uVar5]);
    dVar13 = local_a8 + (double)local_68._0_8_ * local_c8;
    dVar10 = local_b0 + dVar12 * dStack_c0;
    dVar11 = local_58 -
             (double)local_e0._M_impl.super__Vector_impl_data._M_start[uVar5] *
             (double)local_68._0_8_ * local_c8 * (double)local_88._0_8_;
    dVar12 = dStack_50 -
             (double)local_e0._M_impl.super__Vector_impl_data._M_start[uVar5] * dVar12 * dStack_c0 *
             (double)local_88._8_8_;
  }
  uVar7 = 0;
  uVar8 = 0;
  dVar9 = dVar10;
  if ((idat->shiftedPot == false) && (dVar9 = 0.0, idat->shiftedForce == true)) {
    uVar7 = SUB84(dVar12,0);
    uVar8 = (undefined4)((ulong)dVar12 >> 0x20);
    dVar9 = dVar12 * (idat->rij - idat->rcut) + dVar10;
  }
  dVar10 = idat->sw;
  dVar12 = idat->vdwMult;
  dVar13 = (dVar13 - dVar9) * dVar12;
  idat->vpair = idat->vpair + dVar13;
  dVar13 = dVar13 * dVar10;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar13;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar13 + (idat->selePot).data_[1];
  }
  operator*(&local_48,&(idat->d).super_Vector<double,_3U>,
            (dVar11 - (double)CONCAT44(uVar8,uVar7)) * dVar12 * dVar10);
  operator/(&local_30,&local_48,idat->rij);
  Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e0);
  return;
}

Assistant:

void InversePowerSeries::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    InversePowerSeriesInteractionData& mixer =
        MixingMap[InversePowerSeriesTids[idat.atid1]]
                 [InversePowerSeriesTids[idat.atid2]];
    std::vector<int> powers            = mixer.powers;
    std::vector<RealType> coefficients = mixer.coefficients;

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType ri  = 1.0 / idat.rij;
    RealType ric = 1.0 / idat.rcut;

    RealType fn, fnc;

    for (unsigned int i = 0; i < powers.size(); i++) {
      fn  = coefficients[i] * pow(ri, powers[i]);
      fnc = coefficients[i] * pow(ric, powers[i]);
      myPot += fn;
      myPotC += fnc;
      myDeriv -= powers[i] * fn * ri;
      myDerivC -= powers[i] * fnc * ric;
    }

    if (idat.shiftedPot) {
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut);
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * (myDeriv - myDerivC);

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }